

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatin.cpp
# Opt level: O1

uint32_t icu_63::CollationFastLatin::getQuaternaries(uint32_t variableTop,uint32_t pair)

{
  uint32_t uVar1;
  uint uVar2;
  
  if (pair < 0x10000) {
    if (0xfff < pair) {
      return (uint)((pair & 0x380) < 0x180) * 0x4000000 + 0xfc00fc00;
    }
    uVar1 = 0xfc00;
    if (pair <= variableTop) {
      uVar2 = pair & 0xff8;
      if (pair < 0xc00) {
        uVar2 = pair;
      }
      return uVar2;
    }
  }
  else {
    uVar1 = 0xfc00fc00;
    if ((pair & 0xffff) <= variableTop) {
      uVar1 = pair & 0xfff8fff8;
    }
  }
  return uVar1;
}

Assistant:

uint32_t
CollationFastLatin::getQuaternaries(uint32_t variableTop, uint32_t pair) {
    // Return the primary weight of a variable CE,
    // or the maximum primary weight for a non-variable, not-completely-ignorable CE.
    if(pair <= 0xffff) {
        // one mini CE
        if(pair >= MIN_SHORT) {
            // A high secondary weight means we really have two CEs,
            // a primary CE and a secondary CE.
            if((pair & SECONDARY_MASK) >= MIN_SEC_HIGH) {
                pair = TWO_SHORT_PRIMARIES_MASK;
            } else {
                pair = SHORT_PRIMARY_MASK;
            }
        } else if(pair > variableTop) {
            pair = SHORT_PRIMARY_MASK;
        } else if(pair >= MIN_LONG) {
            pair &= LONG_PRIMARY_MASK;  // variable
        }
        // else special mini CE
    } else {
        // two mini CEs, same primary groups, neither expands like above
        uint32_t ce = pair & 0xffff;
        if(ce > variableTop) {
            pair = TWO_SHORT_PRIMARIES_MASK;
        } else {
            U_ASSERT(ce >= MIN_LONG);
            pair &= TWO_LONG_PRIMARIES_MASK;  // variable
        }
    }
    return pair;
}